

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void __thiscall
flatbuffers::php::PhpGenerator::GetStructFieldOfStruct
          (PhpGenerator *this,FieldDef *field,string *code_ptr)

{
  Type *type;
  Type *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  PhpGenerator *this_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)field;
  field_local = (FieldDef *)this;
  std::operator+(&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator+(&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @return ");
  GenTypeGet_abi_cxx11_(&local_d8,(PhpGenerator *)&code_ptr_local[6]._M_string_length,type);
  std::operator+(&local_98,&local_b8,&local_d8);
  std::operator+(&local_78,&local_98,"\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::operator+(&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," */\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::operator+(&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"public function get");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  ConvertCase(&local_158,code_ptr_local,kUpperCamel,kSnake);
  std::operator+(&local_138,&local_158,"()\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::operator+(&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::operator+(&local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_198,&local_1b8,"$obj = new ");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  GenTypeGet_abi_cxx11_(&local_1f8,(PhpGenerator *)&code_ptr_local[6]._M_string_length,type_00);
  std::operator+(&local_1d8,&local_1f8,"();\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::operator+(&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_218,&local_238,"$obj->init($this->bb_pos + ");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  NumToString<unsigned_short>(&local_278,(unsigned_short)code_ptr_local[8]._M_string_length);
  std::operator+(&local_258,&local_278,", $this->bb);");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::operator+(&local_2d8,"\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_2b8,&local_2d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_298,&local_2b8,"return $obj;\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::operator+(&local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  return;
}

Assistant:

void GetStructFieldOfStruct(const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += Indent + "/**\n";
    code += Indent + " * @return " + GenTypeGet(field.value.type) + "\n";
    code += Indent + " */\n";
    code += Indent + "public function get";
    code += ConvertCase(field.name, Case::kUpperCamel) + "()\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$obj = new ";
    code += GenTypeGet(field.value.type) + "();\n";
    code += Indent + Indent + "$obj->init($this->bb_pos + ";
    code += NumToString(field.value.offset) + ", $this->bb);";
    code += "\n" + Indent + Indent + "return $obj;\n";
    code += Indent + "}\n\n";
  }